

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
Intersect<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
              vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  bool bVar1;
  reference piVar2;
  bool local_229;
  bool local_201;
  _Self local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  _Self local_1a0;
  reference local_198;
  int *x_3;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  _Self local_168;
  _Self local_160;
  _Self local_158;
  _Self local_150;
  reference local_148;
  int *x_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  int *x_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> sB;
  set<int,_std::less<int>,_std::allocator<int>_> sA;
  set<int,_std::less<int>,_std::allocator<int>_> s;
  vector<int,_std::allocator<int>_> *B_local;
  vector<int,_std::allocator<int>_> *A_local;
  vector<int,_std::allocator<int>_> *v;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &sA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &sB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end0 = std::vector<int,_std::allocator<int>_>::begin(A);
  x = (int *)std::vector<int,_std::allocator<int>_>::end(A);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&x), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &sB._M_t._M_impl.super__Rb_tree_header._M_node_count,piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  __end0_1 = std::vector<int,_std::allocator<int>_>::begin(B);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end(B);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)&x_1), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end0_1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0_1);
  }
  __end0_2 = std::vector<int,_std::allocator<int>_>::begin(A);
  x_2 = (int *)std::vector<int,_std::allocator<int>_>::end(A);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_2,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)&x_2), bVar1) {
    local_148 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end0_2);
    local_150._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sB._M_t._M_impl.super__Rb_tree_header._M_node_count,local_148);
    local_158._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sB._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator!=(&local_150,&local_158);
    local_201 = false;
    if (bVar1) {
      local_160._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,local_148);
      local_168._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      local_201 = std::operator!=(&local_160,&local_168);
    }
    if (local_201 != false) {
      std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,local_148);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &sA._M_t._M_impl.super__Rb_tree_header._M_node_count,local_148);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0_2);
  }
  __end0_3 = std::vector<int,_std::allocator<int>_>::begin(A);
  x_3 = (int *)std::vector<int,_std::allocator<int>_>::end(A);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_3,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)&x_3), bVar1) {
    local_198 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end0_3);
    local_1a0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sB._M_t._M_impl.super__Rb_tree_header._M_node_count,local_198);
    local_1a8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &sB._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator!=(&local_1a0,&local_1a8);
    local_229 = false;
    if (bVar1) {
      local_1b0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,local_198);
      local_1b8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      bVar1 = std::operator!=(&local_1b0,&local_1b8);
      local_229 = false;
      if (bVar1) {
        local_1c0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        &sA._M_t._M_impl.super__Rb_tree_header._M_node_count,local_198);
        local_1c8._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        &sA._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_229 = std::operator==(&local_1c0,&local_1c8);
      }
    }
    if (local_229 != false) {
      std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,local_198);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0_3);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &sB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &sA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

vector<T> Intersect(const vector<T> &A, const vector<T> &B) {
    vector<T> v;
    set<T> s;
    set<T> sA;
    set<T> sB;
    for (auto &x : A) {
        sA.insert(x);
    }
    for (auto &x : B) {
        sB.insert(x);
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end()) {
            v.emplace_back(x);
            s.insert(x);
        }
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end() && s.find(x) == s.end()) {
            v.emplace_back(x);
        }
    }
    return v;
}